

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

void xmlSchemaPErrFull(xmlSchemaParserCtxtPtr ctxt,xmlNodePtr node,int code,xmlErrorLevel level,
                      char *file,int line,xmlChar *str1,xmlChar *str2,xmlChar *str3,int col,
                      char *msg,...)

{
  char in_AL;
  int iVar1;
  long lVar2;
  xmlGenericErrorFunc *pp_Var3;
  void **ppvVar4;
  void *data;
  xmlGenericErrorFunc channel;
  xmlStructuredErrorFunc schannel;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  undefined1 local_e8 [48];
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  if (ctxt == (xmlSchemaParserCtxtPtr)0x0) {
    schannel = (xmlStructuredErrorFunc)0x0;
    data = (void *)0x0;
    channel = (xmlGenericErrorFunc)0x0;
  }
  else {
    if (ctxt->err == 2) {
      return;
    }
    lVar2 = 0x18;
    if (level != XML_ERR_WARNING) {
      ctxt->nberrors = ctxt->nberrors + 1;
      ctxt->err = code;
      lVar2 = 0x10;
    }
    channel = *(xmlGenericErrorFunc *)((long)&ctxt->type + lVar2);
    data = ctxt->errCtxt;
    schannel = ctxt->serror;
  }
  if (channel == (xmlGenericErrorFunc)0x0 && schannel == (xmlStructuredErrorFunc)0x0) {
    pp_Var3 = __xmlGenericError();
    channel = *pp_Var3;
    ppvVar4 = __xmlGenericErrorContext();
    data = *ppvVar4;
  }
  ap[0].reg_save_area = local_e8;
  ap[0].overflow_arg_area = &stack0x00000030;
  ap[0].gp_offset = 0x30;
  ap[0].fp_offset = 0x30;
  iVar1 = xmlVRaiseError(schannel,channel,data,ctxt,node,0x10,code,level,(char *)0x0,0,(char *)str1,
                         (char *)str2,(char *)str3,0,0,msg,ap);
  if (iVar1 < 0) {
    xmlSchemaPErrMemory(ctxt);
  }
  return;
}

Assistant:

static void LIBXML_ATTR_FORMAT(11,12)
xmlSchemaPErrFull(xmlSchemaParserCtxtPtr ctxt, xmlNodePtr node, int code,
                  xmlErrorLevel level, const char *file, int line,
                  const xmlChar *str1, const xmlChar *str2, const xmlChar *str3,
                  int col, const char *msg, ...) {
    xmlGenericErrorFunc channel = NULL;
    xmlStructuredErrorFunc schannel = NULL;
    void *data = NULL;
    int res;
    va_list ap;

    if (ctxt != NULL) {
        /* Don't overwrite memory errors */
        if (ctxt->err == XML_ERR_NO_MEMORY)
            return;

        if (level == XML_ERR_WARNING) {
            channel = ctxt->warning;
        } else {
            ctxt->nberrors++;
            ctxt->err = code;
            channel = ctxt->error;
        }
        data = ctxt->errCtxt;
        schannel = ctxt->serror;
    }